

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O0

void BMP_SetPixelRGB(BMP *bmp,unsigned_long x,unsigned_long y,uchar r,uchar g,uchar b)

{
  uchar *puVar1;
  uchar bytes_per_pixel;
  unsigned_long bytes_per_row;
  uchar *pixel;
  uchar b_local;
  uchar g_local;
  uchar r_local;
  unsigned_long y_local;
  unsigned_long x_local;
  BMP *bmp_local;
  
  if (((bmp == (BMP *)0x0) || ((bmp->Header).Width <= x)) || ((bmp->Header).Height <= y)) {
    BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
  }
  else if (((bmp->Header).BitsPerPixel == 0x18) || ((bmp->Header).BitsPerPixel == 0x20)) {
    BMP_LAST_ERROR_CODE = BMP_OK;
    puVar1 = bmp->Data +
             (((bmp->Header).Height - y) + -1) *
             ((bmp->Header).ImageDataSize / (bmp->Header).Height) +
             x * (byte)((int)(uint)(bmp->Header).BitsPerPixel >> 3);
    puVar1[2] = r;
    puVar1[1] = g;
    *puVar1 = b;
  }
  else {
    BMP_LAST_ERROR_CODE = BMP_TYPE_MISMATCH;
  }
  return;
}

Assistant:

void BMP_SetPixelRGB( BMP* bmp, UINT x, UINT y, UCHAR r, UCHAR g, UCHAR b )
{
	UCHAR*	pixel;
	UINT	bytes_per_row;
	UCHAR	bytes_per_pixel;

	if ( bmp == NULL || x < 0 || x >= bmp->Header.Width || y < 0 || y >= bmp->Header.Height )
	{
		BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
	}

	else if ( bmp->Header.BitsPerPixel != 24 && bmp->Header.BitsPerPixel != 32 )
	{
		BMP_LAST_ERROR_CODE = BMP_TYPE_MISMATCH;
	}

	else
	{
		BMP_LAST_ERROR_CODE = BMP_OK;

		bytes_per_pixel = bmp->Header.BitsPerPixel >> 3;

		/* Row's size is rounded up to the next multiple of 4 bytes */
		bytes_per_row = bmp->Header.ImageDataSize / bmp->Header.Height;

		/* Calculate the location of the relevant pixel (rows are flipped) */
		pixel = bmp->Data + ( ( bmp->Header.Height - y - 1 ) * bytes_per_row + x * bytes_per_pixel );

		/* Note: colors are stored in BGR order */
		*( pixel + 2 ) = r;
		*( pixel + 1 ) = g;
		*( pixel + 0 ) = b;
	}
}